

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O2

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
::_throwIfValueDoesNotCompare
          (HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
           *this,pair<unsigned_long,_duckdb::hugeint_t> *value)

{
  FailedComparison *this_00;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  bVar1 = std::operator!=(value,value);
  if (!bVar1) {
    return;
  }
  this_00 = (FailedComparison *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,
             "Can not work with something that does not compare equal to itself.",&local_39);
  FailedComparison::FailedComparison(this_00,&local_38);
  __cxa_throw(this_00,&FailedComparison::typeinfo,Exception::~Exception);
}

Assistant:

void HeadNode<T, _Compare>::_throwIfValueDoesNotCompare(const T &value) const {
    if (value != value) {
        throw FailedComparison(
            "Can not work with something that does not compare equal to itself.");
    }
}